

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_hashtable_remove(arg_hashtable_t *h,void *k)

{
  arg_hashtable_entry **ppaVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  arg_hashtable_entry **ppaVar6;
  arg_hashtable_entry *__ptr;
  
  uVar3 = (*h->hashfn)(k);
  uVar3 = ~(uVar3 << 9) + uVar3;
  uVar3 = (uVar3 * 0x40000 | uVar3 >> 0xe) ^ uVar3;
  uVar5 = uVar3 * 0x11;
  uVar5 = (uVar3 * 0x4400000 | uVar5 >> 10) ^ uVar5;
  uVar2 = (ulong)uVar5 % (ulong)h->tablelength;
  __ptr = h->table[uVar2];
  if (__ptr != (arg_hashtable_entry *)0x0) {
    ppaVar6 = h->table + uVar2;
    do {
      if (uVar5 == __ptr->h) {
        iVar4 = (*h->eqfn)(k,__ptr->k);
        if (iVar4 != 0) {
          *ppaVar6 = __ptr->next;
          h->entrycount = h->entrycount - 1;
          free(__ptr->k);
          free(__ptr->v);
          free(__ptr);
          return;
        }
      }
      ppaVar1 = &__ptr->next;
      ppaVar6 = &__ptr->next;
      __ptr = *ppaVar1;
    } while (*ppaVar1 != (arg_hashtable_entry *)0x0);
  }
  return;
}

Assistant:

void arg_hashtable_remove(arg_hashtable_t* h, const void* k) {
    /*
     * TODO: consider compacting the table when the load factor drops enough,
     *       or provide a 'compact' method.
     */

    struct arg_hashtable_entry* e;
    struct arg_hashtable_entry** pE;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    pE = &(h->table[index]);
    e = *pE;
    while (NULL != e) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k))) {
            *pE = e->next;
            h->entrycount--;
            xfree(e->k);
            xfree(e->v);
            xfree(e);
            return;
        }
        pE = &(e->next);
        e = e->next;
    }
}